

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Skeleton_blocker_complex.h
# Opt level: O0

bool __thiscall
Gudhi::skeleton_blocker::
Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>::contains_vertices
          (Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits> *this,
          Simplex *sigma)

{
  bool bVar1;
  reference pVVar2;
  const_iterator cStack_38;
  Vertex_handle vertex;
  const_iterator __end0;
  const_iterator __begin0;
  Simplex *__range3;
  Simplex *sigma_local;
  Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits> *this_local;
  
  __end0 = Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
           ::begin(sigma);
  cStack_38 = Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
              ::end(sigma);
  while( true ) {
    bVar1 = std::operator!=(&__end0,&stack0xffffffffffffffc8);
    if (!bVar1) {
      return true;
    }
    pVVar2 = std::
             _Rb_tree_const_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
             ::operator*(&__end0);
    bVar1 = contains_vertex(this,(Vertex_handle)pVVar2->vertex);
    if (!bVar1) break;
    std::
    _Rb_tree_const_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
    ::operator++(&__end0);
  }
  return false;
}

Assistant:

bool contains_vertices(const Simplex & sigma) const {
    for (auto vertex : sigma)
      if (!contains_vertex(vertex))
        return false;
    return true;
  }